

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O1

uint64_t yactfr::internal::anon_unknown_0::readFlUIntLe52At4(uint8_t *buf)

{
  return (ulong)(*buf >> 4) |
         (ulong)buf[1] << 4 |
         (ulong)((uint)buf[2] << 0xc | (uint)buf[3] << 0x14) |
         ((ulong)buf[4] | (ulong)((uint)buf[5] << 8 | (uint)buf[6] << 0x10)) << 0x1c;
}

Assistant:

std::uint64_t readFlUIntLe52At4(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[6];
    res <<= 8;
    res |= buf[5];
    res <<= 8;
    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 4;
    res |= (buf[0] >> 4);
    res &= UINT64_C(0xfffffffffffff);
    return res;
}